

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabelPrivate::~QLabelPrivate(QLabelPrivate *this)

{
  _Manager_type p_Var1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  
  *(undefined ***)&(this->super_QFramePrivate).super_QWidgetPrivate = &PTR__QLabelPrivate_007f3a48;
  p_Var1 = (this->resourceProvider).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->resourceProvider,(_Any_data *)&this->resourceProvider,
              __destroy_functor);
  }
  pDVar3 = (this->buddy).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      pDVar3 = (this->buddy).wp.d;
      if (pDVar3 == (Data *)0x0) {
        pDVar3 = (Data *)0x0;
      }
      operator_delete(pDVar3);
    }
  }
  QCursor::~QCursor(&this->cursor);
  QTextCursor::~QTextCursor(&this->shortcutCursor);
  lVar4 = 0x2f0;
  do {
    QMetaObject::Connection::~Connection
              ((Connection *)
               (&(this->super_QFramePrivate).super_QWidgetPrivate.super_QObjectPrivate + lVar4));
    lVar4 = lVar4 + -8;
  } while (lVar4 != 0x2e0);
  pDVar3 = (this->movie).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      pDVar3 = (this->movie).wp.d;
      if (pDVar3 == (Data *)0x0) {
        pDVar3 = (Data *)0x0;
      }
      operator_delete(pDVar3);
    }
  }
  if ((this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
      super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>.
      _M_engaged == true) {
    (this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
    super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>.
    _M_engaged = false;
    QPicture::~QPicture((QPicture *)&this->picture);
  }
  if ((this->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_engaged == true) {
    (this->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
    super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
    _M_engaged = false;
    QIcon::~QIcon((QIcon *)&this->icon);
  }
  pDVar2 = (this->text).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->text).d.d)->super_QArrayData,2,0x10);
    }
  }
  QFramePrivate::~QFramePrivate(&this->super_QFramePrivate);
  return;
}

Assistant:

QLabelPrivate::~QLabelPrivate()
{
}